

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * nivalis::util::str_replace(string_view src,string *from,string_view to)

{
  unsigned_long uVar1;
  value_type vVar2;
  reference pvVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  ulong in_RCX;
  string *in_RDI;
  bool bVar6;
  size_t i_1;
  size_t i;
  size_t right;
  size_t left;
  vector<unsigned_long,_std::allocator<unsigned_long>_> za;
  size_t sz;
  string *out;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  ulong local_90;
  unsigned_long local_80;
  unsigned_long local_78;
  ulong local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  ulong local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_38 = std::__cxx11::string::size();
  std::__cxx11::string::push_back((char)in_RCX);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::size();
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x126be3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10,
             (size_type)in_stack_ffffffffffffff08,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x126c0c);
  vVar2 = std::__cxx11::string::size();
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_50,0);
  *pvVar3 = vVar2;
  local_70 = 0;
  local_78 = 0;
  for (local_80 = 1; uVar1 = local_80, uVar4 = std::__cxx11::string::size(), uVar1 < uVar4;
      local_80 = local_80 + 1) {
    if ((local_78 < local_80) ||
       (pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_50,local_80 - local_70), (local_78 - local_80) + 1 <= *pvVar3)) {
      local_70 = local_80;
      puVar5 = std::max<unsigned_long>(&local_80,&local_78);
      local_78 = *puVar5;
      while( true ) {
        uVar1 = local_78;
        uVar4 = std::__cxx11::string::size();
        bVar6 = false;
        if (uVar1 < uVar4) {
          in_stack_ffffffffffffff10 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::operator[](in_RCX);
          in_stack_ffffffffffffff04 = (int)(char)in_stack_ffffffffffffff10->_M_dataplus;
          in_stack_ffffffffffffff08 =
               (basic_string_view<char,_std::char_traits<char>_> *)
               std::__cxx11::string::operator[](in_RCX);
          bVar6 = in_stack_ffffffffffffff04 == (char)in_stack_ffffffffffffff08->_M_len;
        }
        if (!bVar6) break;
        local_78 = local_78 + 1;
      }
      vVar2 = local_78 - local_70;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,local_80);
      *pvVar3 = vVar2;
      local_78 = local_78 - 1;
    }
    else {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,local_80 - local_70);
      vVar2 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,local_80);
      *pvVar3 = vVar2;
    }
  }
  std::__cxx11::string::string((string *)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_90 = local_38;
  while( true ) {
    local_90 = local_90 + 1;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= local_90) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_50,local_90);
    if (*pvVar3 < local_38) {
      std::__cxx11::string::operator[](in_RCX);
      std::__cxx11::string::push_back((char)in_RDI);
    }
    else {
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_90 = (local_38 - 1) + local_90;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  return in_RDI;
}

Assistant:

std::string str_replace(std::string_view src, std::string from, std::string_view to) {
    size_t sz = from.size();
    from.push_back('\v'); from.append(src);

    std::vector<size_t> za(from.size());
    za[0] = from.size();
    size_t left = 0, right = 0;
    for (size_t i = 1; i < from.size(); ++i) {
        if (right >= i && size_t(za[i - left]) < right - i + 1) za[i] = za[i - left];
        else {
            left = i; right = std::max(i, right);
            while (right < from.size() && from[right] == from[right - left]) ++right;
            za[i] = right - left; --right;
        }
    }
    std::string out; out.reserve(src.size());
    for (size_t i = sz + 1; i < from.size(); ++i) {
        if (za[i] >= sz) {
            out.append(to);
            i += sz - 1;
        } else {
            out.push_back(from[i]);
        }
    }
    return out;
}